

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O3

void compute_padded_integral_img_faster_alg(float *gray_image,integral_image *iimage)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  float *pfVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  float fVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  byte bVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  float *pfVar32;
  float *pfVar33;
  int iVar34;
  float *pfVar35;
  long lVar36;
  float *pfVar37;
  float *pfVar38;
  ulong uVar39;
  float *pfVar40;
  float *pfVar41;
  int iVar42;
  ulong uVar43;
  int iVar44;
  long lVar45;
  int iVar46;
  ulong uVar47;
  ushort uVar48;
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar56 [64];
  float fVar57;
  float fVar58;
  undefined1 auVar59 [16];
  float *local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  undefined1 auVar55 [32];
  undefined1 auVar60 [32];
  
  pfVar5 = iimage->padded_data;
  iVar2 = iimage->data_width;
  lVar36 = (long)iVar2;
  iVar31 = iimage->width;
  iVar3 = iimage->data_height;
  iVar46 = iVar2 - iVar31;
  iVar30 = iimage->height;
  uVar24 = iVar46 / 2;
  uVar43 = (ulong)uVar24;
  if (1 < iVar46) {
    uVar47 = 0;
    do {
      uVar26 = 0;
      if (7 < iVar2) {
        memset(pfVar5 + uVar47,0,(ulong)(iVar2 - 8U >> 3) * 0x20 + 0x20);
        uVar26 = (iVar2 - 8U & 0xfffffff8) + 8;
      }
      if ((int)uVar26 < iVar2) {
        memset(pfVar5 + (int)((int)uVar47 + uVar26),0,(ulong)(~uVar26 + iVar2) * 4 + 4);
      }
      uVar47 = (ulong)(uint)((int)uVar47 + iVar2);
      uVar43 = uVar43 - 1;
    } while (uVar43 != 0);
  }
  if ((int)uVar24 < iVar3) {
    iVar25 = uVar24 - 7;
    iVar34 = 8;
    if (8 < iVar25) {
      iVar34 = iVar25;
    }
    iVar42 = 0;
    do {
      iVar44 = (uVar24 + iVar42) * iVar2;
      lVar27 = 0;
      if (0xf < iVar46) {
        memset(pfVar5 + iVar44,0,(ulong)(iVar34 - 1U >> 3) * 0x20 + 0x20);
        lVar27 = 0;
        do {
          lVar27 = lVar27 + 8;
        } while (lVar27 < iVar25);
      }
      uVar26 = (uint)lVar27;
      if ((int)uVar26 < (int)uVar24) {
        memset(pfVar5 + (int)(iVar44 + uVar26),0,(ulong)(~uVar26 + uVar24) * 4 + 4);
      }
      iVar42 = iVar42 + 1;
    } while (iVar42 != iVar3 - uVar24);
  }
  uVar26 = iimage->width;
  lVar27 = (long)(int)uVar26;
  lVar45 = (long)iimage->data_width;
  uVar4 = iimage->height;
  pfVar35 = iimage->data;
  uVar43 = lVar27 - 2;
  uVar47 = (ulong)uVar26;
  if (lVar27 < 3) {
    fVar57 = 0.0;
    fVar58 = 0.0;
    uVar28 = 0;
  }
  else {
    fVar58 = 0.0;
    fVar57 = 0.0;
    uVar28 = 0;
    do {
      fVar20 = fVar58 + gray_image[uVar28];
      pfVar35[uVar28] = fVar20;
      fVar58 = fVar20 + gray_image[uVar28 + 1];
      pfVar35[uVar28 + 1] = fVar58;
      fVar1 = gray_image[uVar47 + uVar28];
      pfVar35[lVar45 + uVar28] = fVar20 + fVar57 + fVar1;
      fVar57 = fVar57 + fVar1 + gray_image[uVar47 + uVar28 + 1];
      pfVar35[lVar45 + uVar28 + 1] = fVar57 + pfVar35[uVar28 + 1];
      uVar28 = uVar28 + 2;
    } while (uVar28 < (uVar43 & 0xffffffff));
  }
  if ((int)uVar28 < (int)uVar26) {
    uVar28 = uVar28 & 0xffffffff;
    do {
      fVar58 = fVar58 + gray_image[uVar28];
      pfVar35[uVar28] = fVar58;
      fVar57 = fVar57 + gray_image[lVar27 + uVar28];
      pfVar35[lVar45 + uVar28] = fVar58 + fVar57;
      uVar28 = uVar28 + 1;
    } while (uVar47 != uVar28);
  }
  uVar28 = 2;
  if (4 < (int)uVar4) {
    pfVar33 = pfVar35 + lVar45 + 1;
    local_80 = pfVar35 + lVar45;
    pfVar40 = pfVar35 + lVar45 * 3 + 1;
    local_68 = pfVar35 + lVar45 * 3;
    local_70 = gray_image + lVar27 * 3;
    pfVar41 = gray_image + lVar27 * 3 + 1;
    local_78 = pfVar35 + lVar45 * 2;
    pfVar37 = gray_image + lVar27 * 2 + 1;
    pfVar38 = gray_image + lVar27 * 2;
    pfVar32 = pfVar35 + lVar45 * 2 + 1;
    uVar28 = 2;
    do {
      fVar58 = 0.0;
      uVar39 = 0;
      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
      if (2 < (int)uVar26) {
        uVar39 = 0;
        do {
          fVar57 = auVar56._0_4_ + pfVar37[uVar39 - 1];
          fVar1 = fVar57 + pfVar33[uVar39 - 1];
          pfVar32[uVar39 - 1] = fVar1;
          fVar57 = fVar57 + pfVar37[uVar39];
          auVar56 = ZEXT464((uint)fVar57);
          pfVar32[uVar39] = fVar57 + pfVar33[uVar39];
          fVar57 = pfVar41[uVar39 - 1];
          pfVar40[uVar39 - 1] = fVar1 + fVar58 + fVar57;
          fVar58 = fVar58 + fVar57 + pfVar41[uVar39];
          pfVar40[uVar39] = fVar58 + pfVar32[uVar39];
          uVar39 = uVar39 + 2;
        } while ((long)uVar39 < (long)uVar43);
      }
      if ((int)uVar39 < (int)uVar26) {
        uVar39 = uVar39 & 0xffffffff;
        lVar29 = 0;
        do {
          fVar57 = auVar56._0_4_ + pfVar38[uVar39 + lVar29];
          auVar56 = ZEXT464((uint)fVar57);
          fVar57 = fVar57 + local_80[uVar39 + lVar29];
          local_78[uVar39 + lVar29] = fVar57;
          fVar58 = fVar58 + local_70[uVar39 + lVar29];
          local_68[uVar39 + lVar29] = fVar57 + fVar58;
          lVar29 = lVar29 + 1;
        } while (uVar47 - uVar39 != lVar29);
      }
      uVar28 = uVar28 + 2;
      local_68 = local_68 + lVar45 * 2;
      local_70 = local_70 + lVar27 * 2;
      local_78 = local_78 + lVar45 * 2;
      local_80 = local_80 + lVar45 * 2;
      pfVar40 = pfVar40 + lVar45 * 2;
      pfVar41 = pfVar41 + lVar27 * 2;
      pfVar33 = pfVar33 + lVar45 * 2;
      pfVar32 = pfVar32 + lVar45 * 2;
      pfVar37 = pfVar37 + lVar27 * 2;
      pfVar38 = pfVar38 + lVar27 * 2;
    } while (uVar28 < uVar4 - 2);
  }
  if ((int)uVar28 < (int)uVar4) {
    uVar28 = uVar28 & 0xffffffff;
    lVar27 = (long)(int)uVar26;
    lVar29 = (uVar28 - 1) * lVar45;
    pfVar40 = pfVar35 + lVar45 * uVar28 + 1;
    pfVar41 = pfVar35 + lVar29 + 1;
    pfVar38 = pfVar35 + lVar45 * uVar28;
    pfVar37 = gray_image + lVar27 * uVar28 + 1;
    pfVar35 = pfVar35 + lVar29;
    pfVar33 = gray_image + lVar27 * uVar28;
    do {
      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar47 = 0;
      if (2 < (int)uVar26) {
        uVar47 = 0;
        do {
          fVar58 = auVar56._0_4_ + pfVar37[uVar47 - 1];
          pfVar40[uVar47 - 1] = fVar58 + pfVar41[uVar47 - 1];
          fVar58 = fVar58 + pfVar37[uVar47];
          auVar56 = ZEXT464((uint)fVar58);
          pfVar40[uVar47] = fVar58 + pfVar41[uVar47];
          uVar47 = uVar47 + 2;
        } while ((long)uVar47 < (long)(int)uVar43);
      }
      if ((int)uVar47 < (int)uVar26) {
        uVar47 = uVar47 & 0xffffffff;
        do {
          fVar58 = auVar56._0_4_ + pfVar33[uVar47];
          auVar56 = ZEXT464((uint)fVar58);
          pfVar38[uVar47] = fVar58 + pfVar35[uVar47];
          uVar47 = uVar47 + 1;
        } while (uVar26 != uVar47);
      }
      uVar28 = uVar28 + 1;
      pfVar40 = pfVar40 + lVar45;
      pfVar41 = pfVar41 + lVar45;
      pfVar37 = pfVar37 + lVar27;
      pfVar38 = pfVar38 + lVar45;
      pfVar35 = pfVar35 + lVar45;
      pfVar33 = pfVar33 + lVar27;
    } while (uVar28 != uVar4);
  }
  iVar46 = uVar24 + iVar30;
  if (0 < iVar30) {
    auVar56 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    iVar30 = iVar31 + uVar24;
    lVar27 = (long)(int)uVar24;
    pfVar35 = pfVar5 + lVar36 * lVar27;
    do {
      fVar58 = pfVar5[(long)((int)lVar27 * iVar2 + iVar30) + -1];
      auVar59._4_4_ = fVar58;
      auVar59._0_4_ = fVar58;
      auVar59._8_4_ = fVar58;
      auVar59._12_4_ = fVar58;
      auVar60._16_4_ = fVar58;
      auVar60._0_16_ = auVar59;
      auVar60._20_4_ = fVar58;
      auVar60._24_4_ = fVar58;
      auVar60._28_4_ = fVar58;
      lVar45 = (long)iVar30;
      iVar34 = iVar30;
      if (iVar30 < (int)(lVar36 + -7)) {
        do {
          *(undefined1 (*) [32])(pfVar35 + lVar45) = auVar60;
          lVar45 = lVar45 + 8;
        } while (lVar45 < lVar36 + -7);
        iVar34 = (int)lVar45;
      }
      if (iVar34 < iVar2) {
        auVar50 = vbroadcastss_avx512f(auVar59);
        auVar51 = vpbroadcastq_avx512f();
        uVar43 = 0;
        do {
          auVar52 = vpbroadcastq_avx512f();
          auVar53 = vporq_avx512f(auVar52,auVar56);
          auVar52 = vporq_avx512f(auVar52,auVar49);
          uVar21 = vpcmpuq_avx512f(auVar52,auVar51,2);
          uVar22 = vpcmpuq_avx512f(auVar53,auVar51,2);
          bVar23 = (byte)uVar22;
          uVar48 = CONCAT11(bVar23,(byte)uVar21);
          pfVar38 = pfVar35 + (long)iVar34 + uVar43;
          bVar6 = (bool)((byte)uVar21 & 1);
          bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar48 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar48 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar48 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar48 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar48 >> 6) & 1);
          bVar13 = (bool)((byte)(uVar48 >> 7) & 1);
          bVar14 = (bool)(bVar23 >> 1 & 1);
          bVar15 = (bool)(bVar23 >> 2 & 1);
          bVar16 = (bool)(bVar23 >> 3 & 1);
          bVar17 = (bool)(bVar23 >> 4 & 1);
          bVar18 = (bool)(bVar23 >> 5 & 1);
          bVar19 = (bool)(bVar23 >> 6 & 1);
          *pfVar38 = (float)((uint)bVar6 * auVar50._0_4_ | (uint)!bVar6 * (int)*pfVar38);
          pfVar38[1] = (float)((uint)bVar7 * auVar50._4_4_ | (uint)!bVar7 * (int)pfVar38[1]);
          pfVar38[2] = (float)((uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * (int)pfVar38[2]);
          pfVar38[3] = (float)((uint)bVar9 * auVar50._12_4_ | (uint)!bVar9 * (int)pfVar38[3]);
          pfVar38[4] = (float)((uint)bVar10 * auVar50._16_4_ | (uint)!bVar10 * (int)pfVar38[4]);
          pfVar38[5] = (float)((uint)bVar11 * auVar50._20_4_ | (uint)!bVar11 * (int)pfVar38[5]);
          pfVar38[6] = (float)((uint)bVar12 * auVar50._24_4_ | (uint)!bVar12 * (int)pfVar38[6]);
          pfVar38[7] = (float)((uint)bVar13 * auVar50._28_4_ | (uint)!bVar13 * (int)pfVar38[7]);
          pfVar38[8] = (float)((uint)(bVar23 & 1) * auVar50._32_4_ |
                              (uint)!(bool)(bVar23 & 1) * (int)pfVar38[8]);
          pfVar38[9] = (float)((uint)bVar14 * auVar50._36_4_ | (uint)!bVar14 * (int)pfVar38[9]);
          pfVar38[10] = (float)((uint)bVar15 * auVar50._40_4_ | (uint)!bVar15 * (int)pfVar38[10]);
          pfVar38[0xb] = (float)((uint)bVar16 * auVar50._44_4_ | (uint)!bVar16 * (int)pfVar38[0xb]);
          pfVar38[0xc] = (float)((uint)bVar17 * auVar50._48_4_ | (uint)!bVar17 * (int)pfVar38[0xc]);
          pfVar38[0xd] = (float)((uint)bVar18 * auVar50._52_4_ | (uint)!bVar18 * (int)pfVar38[0xd]);
          pfVar38[0xe] = (float)((uint)bVar19 * auVar50._56_4_ | (uint)!bVar19 * (int)pfVar38[0xe]);
          pfVar38[0xf] = (float)((uint)(bVar23 >> 7) * auVar50._60_4_ |
                                (uint)!(bool)(bVar23 >> 7) * (int)pfVar38[0xf]);
          uVar43 = uVar43 + 0x10;
        } while (((lVar36 - iVar34) + 0xfU & 0xfffffffffffffff0) != uVar43);
      }
      lVar27 = lVar27 + 1;
      pfVar35 = pfVar35 + lVar36;
    } while (lVar27 < iVar46);
  }
  if (iVar46 < iVar3) {
    lVar27 = (long)iVar46;
    iVar30 = (uVar24 - 7) + iVar31;
    iVar31 = uVar24 + iVar31;
    pfVar35 = pfVar5 + lVar36 * lVar27;
    pfVar38 = pfVar5 + (lVar27 + -1) * lVar36;
    do {
      lVar45 = (long)(int)uVar24;
      uVar26 = uVar24;
      if ((int)uVar24 < iVar30) {
        do {
          *(undefined1 (*) [32])(pfVar35 + lVar45) = *(undefined1 (*) [32])(pfVar38 + lVar45);
          lVar45 = lVar45 + 8;
        } while (lVar45 < iVar30);
        uVar26 = (uint)lVar45;
      }
      if ((int)uVar26 < iVar31) {
        lVar45 = (long)(int)uVar26;
        do {
          pfVar35[lVar45] = pfVar38[lVar45];
          lVar45 = lVar45 + 1;
        } while (iVar31 != lVar45);
      }
      lVar27 = lVar27 + 1;
      pfVar38 = pfVar38 + lVar36;
      pfVar35 = pfVar35 + lVar36;
    } while (lVar27 < iVar3);
    if (iVar46 < iVar3) {
      auVar56 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      lVar27 = (long)iVar46;
      pfVar35 = pfVar5 + lVar36 * lVar27;
      fVar58 = pfVar5[(long)((iVar46 + -1) * iVar2 + iVar31) + -1];
      auVar54._4_4_ = fVar58;
      auVar54._0_4_ = fVar58;
      auVar54._8_4_ = fVar58;
      auVar54._12_4_ = fVar58;
      auVar55._16_4_ = fVar58;
      auVar55._0_16_ = auVar54;
      auVar55._20_4_ = fVar58;
      auVar55._24_4_ = fVar58;
      auVar55._28_4_ = fVar58;
      auVar50 = vbroadcastss_avx512f(auVar54);
      do {
        lVar45 = (long)iVar31;
        iVar30 = iVar31;
        if (iVar31 < (int)(lVar36 + -7)) {
          do {
            *(undefined1 (*) [32])(pfVar35 + lVar45) = auVar55;
            lVar45 = lVar45 + 8;
          } while (lVar45 < lVar36 + -7);
          iVar30 = (int)lVar45;
        }
        if (iVar30 < iVar2) {
          auVar51 = vpbroadcastq_avx512f();
          uVar43 = 0;
          do {
            auVar52 = vpbroadcastq_avx512f();
            auVar53 = vporq_avx512f(auVar52,auVar56);
            auVar52 = vporq_avx512f(auVar52,auVar49);
            uVar21 = vpcmpuq_avx512f(auVar52,auVar51,2);
            uVar22 = vpcmpuq_avx512f(auVar53,auVar51,2);
            bVar23 = (byte)uVar22;
            uVar48 = CONCAT11(bVar23,(byte)uVar21);
            pfVar5 = pfVar35 + (long)iVar30 + uVar43;
            bVar6 = (bool)((byte)uVar21 & 1);
            bVar7 = (bool)((byte)(uVar48 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar48 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar48 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar48 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar48 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar48 >> 6) & 1);
            bVar13 = (bool)((byte)(uVar48 >> 7) & 1);
            bVar14 = (bool)(bVar23 >> 1 & 1);
            bVar15 = (bool)(bVar23 >> 2 & 1);
            bVar16 = (bool)(bVar23 >> 3 & 1);
            bVar17 = (bool)(bVar23 >> 4 & 1);
            bVar18 = (bool)(bVar23 >> 5 & 1);
            bVar19 = (bool)(bVar23 >> 6 & 1);
            *pfVar5 = (float)((uint)bVar6 * auVar50._0_4_ | (uint)!bVar6 * (int)*pfVar5);
            pfVar5[1] = (float)((uint)bVar7 * auVar50._4_4_ | (uint)!bVar7 * (int)pfVar5[1]);
            pfVar5[2] = (float)((uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * (int)pfVar5[2]);
            pfVar5[3] = (float)((uint)bVar9 * auVar50._12_4_ | (uint)!bVar9 * (int)pfVar5[3]);
            pfVar5[4] = (float)((uint)bVar10 * auVar50._16_4_ | (uint)!bVar10 * (int)pfVar5[4]);
            pfVar5[5] = (float)((uint)bVar11 * auVar50._20_4_ | (uint)!bVar11 * (int)pfVar5[5]);
            pfVar5[6] = (float)((uint)bVar12 * auVar50._24_4_ | (uint)!bVar12 * (int)pfVar5[6]);
            pfVar5[7] = (float)((uint)bVar13 * auVar50._28_4_ | (uint)!bVar13 * (int)pfVar5[7]);
            pfVar5[8] = (float)((uint)(bVar23 & 1) * auVar50._32_4_ |
                               (uint)!(bool)(bVar23 & 1) * (int)pfVar5[8]);
            pfVar5[9] = (float)((uint)bVar14 * auVar50._36_4_ | (uint)!bVar14 * (int)pfVar5[9]);
            pfVar5[10] = (float)((uint)bVar15 * auVar50._40_4_ | (uint)!bVar15 * (int)pfVar5[10]);
            pfVar5[0xb] = (float)((uint)bVar16 * auVar50._44_4_ | (uint)!bVar16 * (int)pfVar5[0xb]);
            pfVar5[0xc] = (float)((uint)bVar17 * auVar50._48_4_ | (uint)!bVar17 * (int)pfVar5[0xc]);
            pfVar5[0xd] = (float)((uint)bVar18 * auVar50._52_4_ | (uint)!bVar18 * (int)pfVar5[0xd]);
            pfVar5[0xe] = (float)((uint)bVar19 * auVar50._56_4_ | (uint)!bVar19 * (int)pfVar5[0xe]);
            pfVar5[0xf] = (float)((uint)(bVar23 >> 7) * auVar50._60_4_ |
                                 (uint)!(bool)(bVar23 >> 7) * (int)pfVar5[0xf]);
            uVar43 = uVar43 + 0x10;
          } while (((lVar36 - iVar30) + 0xfU & 0xfffffffffffffff0) != uVar43);
        }
        lVar27 = lVar27 + 1;
        pfVar35 = pfVar35 + lVar36;
      } while (lVar27 < iVar3);
    }
  }
  return;
}

Assistant:

void compute_padded_integral_img_faster_alg(float *gray_image, struct integral_image * iimage) {
    
    float *iimage_padded_data = iimage->padded_data;

    int data_width = iimage->data_width;
    int data_height = iimage->data_height;
    int width = iimage->width;
    int height = iimage->height;

    int border = (data_width - width) / 2; 
    //int border = PADDING_SIZE;

    // Block layout of padded integral image:
    // AAA
    // BIC
    // BDE

    __m256 zeros_float = _mm256_setzero_ps();

    // BLOCK A
    for (int j = 0; j < border; ++j) {
        int i = 0;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK B
    for (int j = border; j < data_height; ++j) {
        int i = 0;
        for (; i < border - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < border; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK I
    {
        float sum = 0.0f;
        float sum1 = 0.0f;
        
        int data_width = iimage->data_width;
        int width = iimage->width;
        int width_limit = width - 2;
        int height_limit = iimage->height - 2;
        float *iimage_data = iimage->data;

        int i = 0;
        // first row extra, since we don't have 0 padding
        for (i = 0; i < width_limit; i += 2) {
            sum += gray_image[i];
            iimage_data[i] = sum;
            sum += gray_image[i + 1];
            iimage_data[i + 1] = sum;

            sum1 += gray_image[width + i];
            iimage_data[data_width + i] = iimage_data[i] + sum1;
            sum1 += gray_image[width + i + 1];
            iimage_data[data_width + i + 1] = iimage_data[i + 1] + sum1;
        }

        // Handle last element of an image with odd width extra.
        // If previous stride = 2, then there should only be one element covered in this loop.
        // This might change if we increase the stride.
        for (; i < width; ++i) {
            sum += gray_image[i];
            iimage_data[i] = sum;
            // printf("row 0, col %i sum: %f\n", i, sum);
            sum1 += gray_image[width + i];
            // printf("row 1, col %i sum: %f\n", i, sum1);
            iimage_data[data_width + i] = iimage_data[i] + sum1;
        }

        // Handle all elements after the first row.
        i = 2;
        for (; i < height_limit; i += 2) {
            sum = 0.0f;
            sum1 = 0.0f;
            int j = 0;
            for (; j < width_limit; j += 2) {
                sum += gray_image[i * width + j];
                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
                sum += gray_image[i * width + j + 1];
                iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;

                sum1 += gray_image[(i + 1) * width + j];
                iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
                sum1 += gray_image[(i + 1) * width + j + 1];
                iimage_data[(i + 1) * data_width + j + 1] = iimage_data[i * data_width + j + 1] + sum1;
            }
            // printf("j: %i\n", j);

            // Handle last element of an image with odd width extra.
            // If previous stride = 2, then there should only be one element covered in this loop.
            // This might change if we increase the stride.
            for (; j < width; ++j) {
                // printf("j: %i; sum1: %f\n", j, sum1);
                sum += gray_image[i * width + j];
                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;

                sum1 += gray_image[(i + 1) * width + j];
                // printf("sum1: %f\n", sum1);
                iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
            }
        }

        // Handle last element of an image with odd height extra.
        // If previous stride = 2, then there should only be one row covered in this loop.
        // This might change if we increase the stride.
        for (; i < iimage->height ; ++i) {
            sum = 0.0f;
            int j = 0;
            for (; j < width_limit; j += 2) {
                // printf("j: %i; sum1: %f\n", j, sum);

                sum += gray_image[i * width + j];
                // printf("j: %i; sum1: %f\n", j, sum);
                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
                sum += gray_image[i * width + j + 1];
                // printf("j: %i; sum1: %f\n", j, sum);

                iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;
            }
            // printf("j: %i\n", j);

            for (; j < width; ++j) {
                sum += gray_image[i * width + j];
                // printf("j: %i; sum1: %f\n", j, sum);

                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
            }
        }
    }

    // BLOCK C
    for (int j = border; j < border + height; ++j) {
        float last_element_in_row_float = iimage_padded_data[j * data_width + border + width - 1];
        __m256 last_element_in_row_vec = _mm256_set1_ps(last_element_in_row_float);
        int i = width + border;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, last_element_in_row_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = last_element_in_row_float;
        }
    }

    // BLOCK D   
    for (int j = border + height; j < data_height; ++j) {
        int i = border;
        for (; i < width + border - 7; i+=8) {
            __m256 prev_elements_in_row = _mm256_loadu_ps(iimage_padded_data + (j-1) * data_width + i);
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, prev_elements_in_row);
        }
        for (; i < width + border; ++i) {
            iimage_padded_data[j * data_width + i] = iimage_padded_data[(j-1) * data_width + i];
        }
    }

    // BLOCK E
    int index_last_element = (border + height - 1) * data_width + border + width - 1;
    float max_value_float = iimage_padded_data[index_last_element];
    __m256 max_value_vec = _mm256_set1_ps(max_value_float);
    for (int j = border + height; j < data_height; ++j) {
        int i = border + width;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, max_value_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = max_value_float;
        }
    }
    
}